

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

void __thiscall parser::memo::any::of<hwl::Statement>::~of(of<hwl::Statement> *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_dyn)._vptr_dyn = (_func_int **)&PTR__of_0015b8f0;
  std::vector<hwl::Statement,_std::allocator<hwl::Statement>_>::~vector(&(this->v).body);
  pcVar2 = (this->v).call._M_dataplus._M_p;
  paVar1 = &(this->v).call.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x40);
  return;
}

Assistant:

of (const T& v) : v(v) {}